

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

QTextLayout * __thiscall QTextCursorPrivate::blockLayout(QTextCursorPrivate *this,QTextBlock *block)

{
  QAbstractTextDocumentLayout *pQVar1;
  int iVar2;
  QTextLayout *this_00;
  long in_FS_OFFSET;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QTextBlock::layout(block);
  iVar2 = QTextLayout::lineCount(this_00);
  if ((iVar2 == 0) && (pQVar1 = this->priv->lout, pQVar1 != (QAbstractTextDocumentLayout *)0x0)) {
    (**(code **)(*(long *)pQVar1 + 0x88))(local_40,pQVar1,block);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextLayout *QTextCursorPrivate::blockLayout(QTextBlock &block) const{
    QTextLayout *tl = block.layout();
    if (!tl->lineCount() && priv->layout())
        priv->layout()->blockBoundingRect(block);
    return tl;
}